

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> __thiscall
duckdb::PhysicalHashJoin::InitializeHashTable(PhysicalHashJoin *this,ClientContext *context)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  idx_t iVar1;
  idx_t iVar2;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var3;
  optional_ptr<duckdb::Binder,_true> oVar4;
  ClientContext *pCVar5;
  _func_int **pp_Var6;
  JoinHashTable *this_01;
  pointer pJVar7;
  pointer pBVar8;
  Allocator *args_1;
  long lVar9;
  ClientContext *in_RDX;
  pointer *__ptr;
  undefined8 *puVar10;
  undefined8 *puVar11;
  idx_t *__x;
  byte bVar12;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  aggr;
  vector<duckdb::BoundAggregateExpression_*,_true> correlated_aggregates;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  vector<duckdb::LogicalType,_true> delim_payload_types;
  FunctionBinder function_binder;
  AggregateFunction count_fun;
  FunctionBinder local_498;
  long *local_488;
  long *local_480;
  vector<duckdb::BoundAggregateExpression_*,_true> local_478;
  pointer local_460;
  Expression *local_458;
  size_type sStack_450;
  undefined8 local_448;
  _Head_base<0UL,_duckdb::JoinHashTable_*,_false> local_440;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_438;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_418;
  uint local_40c;
  undefined1 local_408 [16];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3f0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3d0;
  BaseScalarFunction local_3c0;
  undefined8 auStack_310 [13];
  undefined2 local_2a8;
  undefined8 local_2a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_298;
  BaseScalarFunction local_290;
  undefined8 auStack_1e0 [13];
  undefined2 local_178;
  undefined8 local_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  BaseScalarFunction local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar12 = 0;
  this_01 = (JoinHashTable *)operator_new(0x3a0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3c0,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &(context->config).max_expression_depth);
  JoinHashTable::JoinHashTable
            (this_01,in_RDX,
             (vector<duckdb::JoinCondition,_true> *)
             &(context->config).profiler_settings._M_h._M_bucket_count,
             (vector<duckdb::LogicalType,_true> *)&local_3c0,
             *(JoinType *)((long)&(context->config).profiler_settings._M_h._M_buckets + 1),
             (vector<unsigned_long,_true> *)&(context->config).asof_loop_join_threshold);
  (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
  super_PhysicalOperator._vptr_PhysicalOperator = (_func_int **)this_01;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3c0);
  iVar1 = (context->config).dynamic_or_filter_threshold;
  iVar2 = (context->config).late_materialization_max_rows;
  if (((iVar1 != iVar2) &&
      (*(char *)((long)&(context->config).profiler_settings._M_h._M_buckets + 1) == '\a')) &&
     (((long)(iVar2 - iVar1) >> 3) * -0x5555555555555555 + 1 ==
      ((long)((long)(context->config).profiler_settings._M_h._M_before_begin._M_nxt -
             (context->config).profiler_settings._M_h._M_bucket_count) >> 3) * -0x5555555555555555))
  {
    local_440._M_head_impl = (JoinHashTable *)this;
    pJVar7 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator->((unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                         *)this);
    local_438.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_478.
    super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
    .
    super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (BoundAggregateExpression **)0x0;
    local_478.
    super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
    .
    super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_478.
    super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
    .
    super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (BoundAggregateExpression **)0x0;
    local_498.context = (ClientContext *)0x0;
    FunctionBinder::FunctionBinder((FunctionBinder *)local_408,in_RDX);
    CountStarFun::GetFunction();
    local_3d8._M_head_impl = (Expression *)0x0;
    aStack_3d0._M_allocated_capacity = 0;
    aStack_3d0._8_8_ = 0;
    local_480 = (long *)0x0;
    FunctionBinder::BindAggregateFunction
              ((FunctionBinder *)&local_3c0,(AggregateFunction *)local_408,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&local_160,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_3d8,(AggregateType)&local_480);
    pp_Var6 = local_3c0.super_SimpleFunction.super_Function._vptr_Function;
    pCVar5 = local_498.context;
    local_3c0.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)0x0;
    local_498.context = (ClientContext *)pp_Var6;
    if (pCVar5 != (ClientContext *)0x0) {
      (*(code *)(((pCVar5->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    if ((pointer)local_3c0.super_SimpleFunction.super_Function._vptr_Function != (pointer)0x0) {
      (**(code **)(*(_func_int **)
                    (LogicalTypeId *)local_3c0.super_SimpleFunction.super_Function._vptr_Function +
                  8))();
    }
    local_3c0.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)0x0;
    if (local_480 != (long *)0x0) {
      (**(code **)(*local_480 + 8))();
    }
    local_480 = (long *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_3d8);
    local_460 = (pointer)&PTR__AggregateFunction_0199c528;
    local_160.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0199c528;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_160);
    local_3c0.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)
         unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
         ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                      *)&local_498.context);
    if (local_478.
        super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        .
        super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_478.
        super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        .
        super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<duckdb::BoundAggregateExpression*,std::allocator<duckdb::BoundAggregateExpression*>>::
      _M_realloc_insert<duckdb::BoundAggregateExpression*>
                ((vector<duckdb::BoundAggregateExpression*,std::allocator<duckdb::BoundAggregateExpression*>>
                  *)&local_478,
                 (iterator)
                 local_478.
                 super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                 .
                 super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(BoundAggregateExpression **)&local_3c0)
      ;
    }
    else {
      *local_478.
       super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
       .
       super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
       ._M_impl.super__Vector_impl_data._M_finish =
           (BoundAggregateExpression *)local_3c0.super_SimpleFunction.super_Function._vptr_Function;
      local_478.
      super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
      .
      super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_478.
           super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
           .
           super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pBVar8 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                           *)&local_498.context);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&local_438,&(pBVar8->super_Expression).return_type);
    local_3c0.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_498.context;
    this_00 = &(pJVar7->correlated_mark_join_info).correlated_aggregates;
    local_498.context = (ClientContext *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)this_00,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_3c0);
    if ((ClientContext *)local_3c0.super_SimpleFunction.super_Function._vptr_Function !=
        (ClientContext *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                   local_3c0.super_SimpleFunction.super_Function._vptr_Function)->__weak_this_).
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    local_418 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                 *)this_00;
    CountFunctionBase::GetFunction();
    local_458 = (Expression *)0x0;
    sStack_450 = 0;
    local_448 = 0;
    local_40c = 0;
    make_uniq_base<duckdb::Expression,duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_int>
              ((duckdb *)&local_498,&local_3c0.return_type,&local_40c);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_458,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_498);
    if ((GroupedAggregateHashTable *)local_498.binder.ptr != (GroupedAggregateHashTable *)0x0) {
      (*((BaseAggregateHashTable *)
        &(local_498.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)->
        _vptr_BaseAggregateHashTable[1])();
    }
    SimpleFunction::SimpleFunction(&local_290.super_SimpleFunction,&local_3c0.super_SimpleFunction);
    local_290.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__BaseScalarFunction_01999660;
    LogicalType::LogicalType(&local_290.return_type,&local_3c0.return_type);
    this = (PhysicalHashJoin *)local_440._M_head_impl;
    local_290.stability = local_3c0.stability;
    local_290.null_handling = local_3c0.null_handling;
    local_290.errors = local_3c0.errors;
    local_290.collation_handling = local_3c0.collation_handling;
    local_290.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_460;
    puVar10 = auStack_310;
    puVar11 = auStack_1e0;
    for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar11 = *puVar10;
      puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
      puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
    }
    local_178 = local_2a8;
    local_170 = local_2a0;
    local_168 = local_298;
    if (local_298 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_298->_M_use_count = local_298->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_298->_M_use_count = local_298->_M_use_count + 1;
      }
    }
    local_3f8._M_head_impl = local_458;
    aStack_3f0._M_allocated_capacity = sStack_450;
    aStack_3f0._8_8_ = local_448;
    local_458 = (Expression *)0x0;
    sStack_450 = 0;
    local_448 = 0;
    local_488 = (long *)0x0;
    FunctionBinder::BindAggregateFunction
              (&local_498,(AggregateFunction *)local_408,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&local_290,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_3f8,(AggregateType)&local_488);
    pCVar5 = local_498.context;
    local_498.context = (ClientContext *)local_498.binder.ptr;
    local_498.binder.ptr = (Binder *)0x0;
    if (pCVar5 != (ClientContext *)0x0) {
      (*(code *)(((pCVar5->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    if (local_498.binder.ptr != (Binder *)0x0) {
      (*(code *)((((local_498.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                  __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_498.binder.ptr = (Binder *)0x0;
    if (local_488 != (long *)0x0) {
      (**(code **)(*local_488 + 8))();
    }
    local_488 = (long *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_3f8);
    local_290.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_460;
    if (local_168 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_290);
    local_498.binder.ptr =
         (Binder *)
         unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
         ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                      *)&local_498.context);
    if (local_478.
        super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        .
        super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_478.
        super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        .
        super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<duckdb::BoundAggregateExpression*,std::allocator<duckdb::BoundAggregateExpression*>>::
      _M_realloc_insert<duckdb::BoundAggregateExpression*>
                ((vector<duckdb::BoundAggregateExpression*,std::allocator<duckdb::BoundAggregateExpression*>>
                  *)&local_478,
                 (iterator)
                 local_478.
                 super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                 .
                 super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(BoundAggregateExpression **)&local_498)
      ;
    }
    else {
      *local_478.
       super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
       .
       super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = (BoundAggregateExpression *)local_498.binder.ptr
      ;
      local_478.
      super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
      .
      super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_478.
           super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
           .
           super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pBVar8 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                           *)&local_498.context);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&local_438,&(pBVar8->super_Expression).return_type);
    local_498.binder.ptr = (Binder *)local_498.context;
    local_498.context = (ClientContext *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              (local_418,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_498);
    if ((GroupedAggregateHashTable *)local_498.binder.ptr != (GroupedAggregateHashTable *)0x0) {
      (*((BaseAggregateHashTable *)
        &(local_498.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)->
        _vptr_BaseAggregateHashTable[1])();
    }
    args_1 = BufferAllocator::Get(in_RDX);
    __x = &(context->config).dynamic_or_filter_threshold;
    make_uniq<duckdb::GroupedAggregateHashTable,duckdb::ClientContext&,duckdb::Allocator&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::BoundAggregateExpression*,true>&>
              ((duckdb *)&local_498,in_RDX,args_1,(vector<duckdb::LogicalType,_true> *)__x,
               (vector<duckdb::LogicalType,_true> *)&local_438,&local_478);
    oVar4.ptr = local_498.binder.ptr;
    local_498.binder.ptr = (Binder *)0x0;
    _Var3._M_head_impl =
         (pJVar7->correlated_mark_join_info).correlated_counts.
         super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl;
    (pJVar7->correlated_mark_join_info).correlated_counts.
    super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
         (GroupedAggregateHashTable *)oVar4.ptr;
    if (_Var3._M_head_impl != (GroupedAggregateHashTable *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseAggregateHashTable + 8))();
    }
    if (local_498.binder.ptr != (Binder *)0x0) {
      (*(code *)((((local_498.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                  __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pJVar7->correlated_mark_join_info).correlated_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)__x);
    DataChunk::Initialize
              (&(pJVar7->correlated_mark_join_info).group_chunk,args_1,
               (vector<duckdb::LogicalType,_true> *)__x,0x800);
    DataChunk::Initialize
              (&(pJVar7->correlated_mark_join_info).result_chunk,args_1,
               (vector<duckdb::LogicalType,_true> *)&local_438,0x800);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_458);
    local_3c0.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_460;
    if (local_298 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_3c0);
    if (local_498.context != (ClientContext *)0x0) {
      (*(code *)((((local_498.context)->super_enable_shared_from_this<duckdb::ClientContext>).
                  __weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if (local_478.
        super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        .
        super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_478.
                      super_vector<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                      .
                      super__Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_438);
  }
  return (unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>)
         (__uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>)this;
}

Assistant:

unique_ptr<JoinHashTable> PhysicalHashJoin::InitializeHashTable(ClientContext &context) const {
	auto result = make_uniq<JoinHashTable>(context, conditions, payload_columns.col_types, join_type,
	                                       rhs_output_columns.col_idxs);
	if (!delim_types.empty() && join_type == JoinType::MARK) {
		// correlated MARK join
		if (delim_types.size() + 1 == conditions.size()) {
			// the correlated MARK join has one more condition than the amount of correlated columns
			// this is the case in a correlated ANY() expression
			// in this case we need to keep track of additional entries, namely:
			// - (1) the total amount of elements per group
			// - (2) the amount of non-null elements per group
			// we need these to correctly deal with the cases of either:
			// - (1) the group being empty [in which case the result is always false, even if the comparison is NULL]
			// - (2) the group containing a NULL value [in which case FALSE becomes NULL]
			auto &info = result->correlated_mark_join_info;

			vector<LogicalType> delim_payload_types;
			vector<BoundAggregateExpression *> correlated_aggregates;
			unique_ptr<BoundAggregateExpression> aggr;

			// jury-rigging the GroupedAggregateHashTable
			// we need a count_star and a count to get counts with and without NULLs

			FunctionBinder function_binder(context);
			aggr = function_binder.BindAggregateFunction(CountStarFun::GetFunction(), {}, nullptr,
			                                             AggregateType::NON_DISTINCT);
			correlated_aggregates.push_back(&*aggr);
			delim_payload_types.push_back(aggr->return_type);
			info.correlated_aggregates.push_back(std::move(aggr));

			auto count_fun = CountFunctionBase::GetFunction();
			vector<unique_ptr<Expression>> children;
			// this is a dummy but we need it to make the hash table understand whats going on
			children.push_back(make_uniq_base<Expression, BoundReferenceExpression>(count_fun.return_type, 0U));
			aggr = function_binder.BindAggregateFunction(count_fun, std::move(children), nullptr,
			                                             AggregateType::NON_DISTINCT);
			correlated_aggregates.push_back(&*aggr);
			delim_payload_types.push_back(aggr->return_type);
			info.correlated_aggregates.push_back(std::move(aggr));

			auto &allocator = BufferAllocator::Get(context);
			info.correlated_counts = make_uniq<GroupedAggregateHashTable>(context, allocator, delim_types,
			                                                              delim_payload_types, correlated_aggregates);
			info.correlated_types = delim_types;
			info.group_chunk.Initialize(allocator, delim_types);
			info.result_chunk.Initialize(allocator, delim_payload_types);
		}
	}
	return result;
}